

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O2

uint8 * __thiscall
sentencepiece::NBestSentencePieceText::_InternalSerialize
          (NBestSentencePieceText *this,uint8 *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  SentencePieceText *this_00;
  void *pvVar2;
  uint8 *puVar3;
  ulong uVar4;
  int iVar5;
  
  iVar1 = (this->nbests_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar5 = 0; iVar1 != iVar5; iVar5 = iVar5 + 1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    this_00 = (SentencePieceText *)
              ((this->nbests_).super_RepeatedPtrFieldBase.rep_)->elements[iVar5];
    *puVar3 = '\n';
    puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray
                       ((this_00->_cached_size_).size_.super___atomic_base<int>._M_i,puVar3 + 1);
    target = SentencePieceText::_InternalSerialize(this_00,puVar3,stream);
  }
  pvVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar2 & 1) == 0) {
    return target;
  }
  uVar4 = (ulong)pvVar2 & 0xfffffffffffffffe;
  puVar3 = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                     (stream,*(void **)(uVar4 + 8),*(int *)(uVar4 + 0x10),target);
  return puVar3;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* NBestSentencePieceText::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:sentencepiece.NBestSentencePieceText)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .sentencepiece.SentencePieceText nbests = 1;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_nbests_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(1, this->_internal_nbests(i), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:sentencepiece.NBestSentencePieceText)
  return target;
}